

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  DiskFileToVirtualFileResult DVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  byte bVar10;
  string virtual_file;
  string shadowing_disk_file;
  string disk_file_1;
  FileDescriptorProto fallback_file;
  string local_168;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  int iVar4;
  
  FileDescriptorProto::FileDescriptorProto(&local_108);
  if (fallback_database == (DescriptorDatabase *)0x0) {
    bVar2 = 0;
  }
  else {
    iVar4 = (*fallback_database->_vptr_DescriptorDatabase[2])(fallback_database,proto,&local_108);
    bVar2 = (byte)iVar4;
  }
  iVar4 = access((proto->_M_dataplus)._M_p,0);
  paVar1 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar1;
  if (iVar4 < 0) {
    local_168._M_string_length = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    bVar3 = DiskSourceTree::VirtualFileToDiskFile(source_tree,proto,&local_168);
    bVar10 = bVar2 | bVar3;
    if (bVar10 == 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      pcVar7 = strerror(2);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    goto LAB_002259ae;
  }
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  DVar5 = DiskSourceTree::DiskFileToVirtualFile(source_tree,proto,&local_168,&local_148);
  bVar10 = 1;
  switch(DVar5) {
  case SUCCESS:
    std::__cxx11::string::_M_assign((string *)proto);
    break;
  case SHADOWED:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,": Input is shadowed in the --proto_path by \"",0x2c);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_148._M_dataplus._M_p,local_148._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
               ,0x78);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
LAB_0022597a:
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    bVar10 = 0;
    break;
  case CANNOT_OPEN:
    if (bVar2 == 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      piVar9 = __errno_location();
      pcVar7 = strerror(*piVar9);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      goto LAB_0022597a;
    }
    break;
  case NO_MAPPING:
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    bVar3 = DiskSourceTree::VirtualFileToDiskFile(source_tree,proto,&local_128);
    bVar10 = bVar2 | bVar3;
    if (bVar10 == 0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(proto->_M_dataplus)._M_p,proto->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                 ,0x152);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar1) {
    operator_delete(local_168._M_dataplus._M_p);
  }
LAB_002259ae:
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return (bool)bVar10;
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << *proto << ": " << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN:
      if (in_fallback_database) {
        return true;
      }
      std::cerr << *proto << ": " << strerror(errno) << std::endl;
      return false;
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}